

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

Options * Flatten(Options *opts,bilingual_str *error)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  Options *in_RDI;
  long in_FS_OFFSET;
  int64_t descendant_limit_bytes;
  bilingual_str *in_stack_ffffffffffffff18;
  bilingual_str *in_stack_ffffffffffffff20;
  bilingual_str *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  ConstevalStringLiteral in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined4 uVar5;
  bilingual_str *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  uVar4 = 1000000;
  piVar2 = std::clamp<int>(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           (int *)in_stack_ffffffffffffff28);
  in_RDI->check_ratio = *piVar2;
  lVar3 = (in_RDI->limits).descendant_size_vbytes * 0x28;
  if ((in_RDI->max_size_bytes < 0) || (in_RDI->max_size_bytes < lVar3)) {
    _(in_stack_ffffffffffffff68);
    ceil((double)lVar3 / 1000000.0);
    tinyformat::format<double>(in_stack_ffffffffffffff78,(double *)CONCAT44(uVar5,uVar4));
    bilingual_str::operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    bilingual_str::~bilingual_str(in_stack_ffffffffffffff18);
    bilingual_str::~bilingual_str(in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CTxMemPool::Options&& Flatten(CTxMemPool::Options&& opts, bilingual_str& error)
{
    opts.check_ratio = std::clamp<int>(opts.check_ratio, 0, 1'000'000);
    int64_t descendant_limit_bytes = opts.limits.descendant_size_vbytes * 40;
    if (opts.max_size_bytes < 0 || opts.max_size_bytes < descendant_limit_bytes) {
        error = strprintf(_("-maxmempool must be at least %d MB"), std::ceil(descendant_limit_bytes / 1'000'000.0));
    }
    return std::move(opts);
}